

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_remove_checked(roaring_bitmap_t *r,uint32_t val)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  shared_container_t *sc;
  run_container_t *prVar6;
  long lVar7;
  void **ppvVar8;
  ushort uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint i;
  int iVar13;
  run_container_t *prVar14;
  ulong uVar15;
  int32_t iVar16;
  _Bool _Var17;
  uint8_t newtypecode;
  uint8_t local_39;
  ulong local_38;
  
  iVar12 = (r->high_low_container).size;
  if ((long)iVar12 == 0) {
LAB_001142aa:
    i = iVar12 - 1;
  }
  else {
    puVar2 = (r->high_low_container).keys;
    uVar9 = (ushort)(val >> 0x10);
    if (puVar2[(long)iVar12 + -1] == uVar9) goto LAB_001142aa;
    uVar11 = 0;
    if (iVar12 < 1) {
      return false;
    }
    iVar13 = iVar12 + -1;
    do {
      i = iVar13 + uVar11 >> 1;
      uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar13 + uVar11 & 0xfffffffe));
      if (uVar1 < uVar9) {
        uVar11 = i + 1;
      }
      else {
        if (uVar1 <= uVar9) goto LAB_001142b5;
        iVar13 = i - 1;
      }
    } while ((int)uVar11 <= iVar13);
    i = ~uVar11;
  }
  if ((int)i < 0) {
    _Var17 = false;
  }
  else {
LAB_001142b5:
    uVar11 = i & 0xffff;
    if (iVar12 <= (int)uVar11) {
      __assert_fail("i < ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1a95,"void ra_unshare_container_at_index(roaring_array_t *, uint16_t)");
    }
    ppvVar8 = (r->high_low_container).containers;
    puVar3 = (r->high_low_container).typecodes;
    sc = (shared_container_t *)ppvVar8[uVar11];
    if (puVar3[uVar11] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar11);
      ppvVar8 = (r->high_low_container).containers;
    }
    *(shared_container_t **)((long)ppvVar8 + (ulong)(uVar11 * 8)) = sc;
    uVar5 = (r->high_low_container).typecodes[uVar11];
    prVar14 = *(run_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar11 * 8));
    prVar6 = prVar14;
    uVar4 = uVar5;
    if (uVar5 == '\x04') {
      uVar4 = *(uint8_t *)&prVar14->runs;
      if (uVar4 == '\x04') goto LAB_0011453f;
      prVar6 = *(run_container_t **)prVar14;
    }
    if (uVar4 == '\x03') {
      lVar7 = cpuid_Extended_Feature_Enumeration_info(7);
      if ((*(uint *)(lVar7 + 4) & 0x20) == 0) {
        iVar16 = prVar6->n_runs;
        lVar7 = (long)iVar16;
        if (0 < lVar7) {
          lVar10 = 0;
          do {
            iVar16 = iVar16 + (uint)prVar6->runs[lVar10].length;
            lVar10 = lVar10 + 1;
          } while (lVar7 != lVar10);
        }
      }
      else {
        iVar16 = _avx2_run_container_cardinality(prVar6);
      }
    }
    else {
      if ((uVar4 != '\x02') && (uVar4 != '\x01')) goto LAB_0011455e;
      iVar16 = prVar6->n_runs;
    }
    local_39 = uVar5;
    prVar6 = (run_container_t *)container_remove(prVar14,(uint16_t)val,uVar5,&local_39);
    uVar15 = (ulong)i;
    if (prVar6 != prVar14) {
      local_38 = uVar15;
      container_free(prVar14,uVar5);
      if ((r->high_low_container).size <= (int)i) goto LAB_00114501;
      (r->high_low_container).containers[local_38] = prVar6;
      (r->high_low_container).typecodes[local_38] = local_39;
      uVar15 = local_38;
    }
    uVar4 = local_39;
    prVar14 = prVar6;
    uVar5 = local_39;
    if (local_39 == '\x04') {
      uVar5 = *(uint8_t *)&prVar6->runs;
      if (uVar5 == '\x04') {
LAB_0011453f:
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      prVar14 = *(run_container_t **)prVar6;
    }
    if (uVar5 == '\x03') {
      lVar7 = cpuid_Extended_Feature_Enumeration_info(7);
      if ((*(uint *)(lVar7 + 4) & 0x20) == 0) {
        iVar12 = prVar14->n_runs;
        lVar7 = (long)iVar12;
        if (0 < lVar7) {
          lVar10 = 0;
          do {
            iVar12 = iVar12 + (uint)prVar14->runs[lVar10].length;
            lVar10 = lVar10 + 1;
          } while (lVar7 != lVar10);
        }
      }
      else {
        iVar12 = _avx2_run_container_cardinality(prVar14);
      }
    }
    else {
      if ((uVar5 != '\x02') && (uVar5 != '\x01')) {
LAB_0011455e:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
      }
      iVar12 = prVar14->n_runs;
    }
    if (iVar12 == 0) {
      container_free((r->high_low_container).containers[uVar15],
                     (r->high_low_container).typecodes[uVar15]);
      ra_remove_at_index(&r->high_low_container,i);
    }
    else {
      if ((r->high_low_container).size <= (int)i) {
LAB_00114501:
        __assert_fail("i < ra->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1a3a,
                      "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                     );
      }
      (r->high_low_container).containers[uVar15] = prVar6;
      (r->high_low_container).typecodes[uVar15] = uVar4;
    }
    _Var17 = iVar16 != iVar12;
  }
  return _Var17;
}

Assistant:

bool roaring_bitmap_remove_checked(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    bool result = false;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, i);
        container_t *container =
            ra_get_container_at_index(&r->high_low_container, i, &typecode);

        const int oldCardinality =
            container_get_cardinality(container, typecode);

        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }

        const int newCardinality =
            container_get_cardinality(container2, newtypecode);

        if (newCardinality != 0) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }

        result = oldCardinality != newCardinality;
    }
    return result;
}